

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void R_GetPlayerTranslation
               (int color,FPlayerColorSet *colorset,FPlayerSkin *skin,FRemapTable *table)

{
  float local_34;
  float local_30;
  float v;
  float s;
  float h;
  FRemapTable *table_local;
  FPlayerSkin *skin_local;
  FPlayerColorSet *colorset_local;
  int color_local;
  
  colorset_local._4_4_ = color;
  if (colorset != (FPlayerColorSet *)0x0) {
    colorset_local._4_4_ = (uint)colorset->RepresentativeColor;
  }
  _s = table;
  table_local = (FRemapTable *)skin;
  skin_local = (FPlayerSkin *)colorset;
  RGBtoHSV((float)((int)colorset_local._4_4_ >> 0x10 & 0xff) / 255.0,
           (float)((int)colorset_local._4_4_ >> 8 & 0xff) / 255.0,
           (float)(colorset_local._4_4_ & 0xff) / 255.0,&v,&local_30,&local_34);
  R_CreatePlayerTranslation
            (v,local_30,local_34,(FPlayerColorSet *)skin_local,(FPlayerSkin *)table_local,_s,
             (FRemapTable *)0x0,(FRemapTable *)0x0);
  return;
}

Assistant:

void R_GetPlayerTranslation (int color, const FPlayerColorSet *colorset, FPlayerSkin *skin, FRemapTable *table)
{
	float h, s, v;

	if (colorset != NULL)
	{
		color = colorset->RepresentativeColor;
	}
	RGBtoHSV (RPART(color)/255.f, GPART(color)/255.f, BPART(color)/255.f,
		&h, &s, &v);

	R_CreatePlayerTranslation (h, s, v, colorset, skin, table, NULL, NULL);
}